

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::EntryReactionTaskFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  JavascriptPromiseReaction *pJVar3;
  JavascriptPromiseCapability *pJVar4;
  RecyclableObject *this;
  ThreadContext *this_00;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  undefined4 *puVar8;
  JavascriptPromiseReactionTaskFunction *pJVar9;
  JavascriptPromise *this_01;
  JavascriptMethod p_Var10;
  Var pvVar11;
  void *pvVar12;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  AutoCatchHandlerExists autoCatchHandlerExists;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x4d6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00cf0739;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_68,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x4d7,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00cf0739;
    *puVar8 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pRVar2 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  pJVar9 = VarTo<Js::JavascriptPromiseReactionTaskFunction,Js::RecyclableObject>(function);
  pJVar3 = (pJVar9->reaction).ptr;
  pvVar12 = (pJVar9->argument).ptr;
  pJVar4 = (pJVar3->capabilities).ptr;
  this = (pJVar3->handler).ptr;
  bVar6 = ScriptContext::IsScriptContextInDebugMode(pSVar1);
  bVar7 = true;
  if (bVar6) {
    pvVar11 = (pJVar4->promise).ptr;
    bVar6 = VarIs<Js::JavascriptPromise>(pvVar11);
    if (bVar6) {
      this_01 = VarTo<Js::JavascriptPromise>(pvVar11);
      bVar7 = WillRejectionBeUnhandled(this_01);
      bVar7 = !bVar7;
    }
  }
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&callInfo_local,pSVar1,bVar7);
  this_00 = pSVar1->threadContext;
  bVar6 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
  if (pSVar1->threadContext->noJsReentrancy == true) {
    Throw::FatalJsReentrancyError();
  }
  p_Var10 = RecyclableObject::GetEntryPoint(this);
  CheckIsExecutable(this,p_Var10);
  p_Var10 = RecyclableObject::GetEntryPoint(this);
  pvVar11 = (*p_Var10)(this,(CallInfo)this,0x2000002,0,0,0,0,0x2000002,pRVar2,pvVar12);
  this_00->reentrancySafeOrHandled = bVar6;
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&callInfo_local);
  if (pvVar11 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x50b,"(handlerResult != nullptr)","handlerResult != nullptr");
    if (!bVar6) {
LAB_00cf0739:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
    pvVar12 = (pJVar4->resolve).ptr;
    pvVar11 = (Var)0x0;
  }
  else {
    pvVar12 = (pJVar4->resolve).ptr;
  }
  pvVar11 = TryCallResolveOrRejectHandler(pvVar12,pvVar11,pSVar1);
  return pvVar11;
}

Assistant:

Var JavascriptPromise::EntryReactionTaskFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        JavascriptPromiseReactionTaskFunction* reactionTaskFunction = VarTo<JavascriptPromiseReactionTaskFunction>(function);
        JavascriptPromiseReaction* reaction = reactionTaskFunction->GetReaction();
        Var argument = reactionTaskFunction->GetArgument();
        JavascriptPromiseCapability* promiseCapability = reaction->GetCapabilities();
        RecyclableObject* handler = reaction->GetHandler();
        Var handlerResult = nullptr;
        JavascriptExceptionObject* exception = nullptr;

        {

            bool isPromiseRejectionHandled = true;
            if (scriptContext->IsScriptContextInDebugMode())
            {
                // only necessary to determine if false if debugger is attached.  This way we'll
                // correctly break on exceptions raised in promises that result in uhandled rejection
                // notifications
                Var promiseVar = promiseCapability->GetPromise();
                if (VarIs<JavascriptPromise>(promiseVar))
                {
                    JavascriptPromise* promise = VarTo<JavascriptPromise>(promiseVar);
                    isPromiseRejectionHandled = !promise->WillRejectionBeUnhandled();
                }
            }

            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext, isPromiseRejectionHandled);
            try
            {
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    handlerResult = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                        handler, Js::CallInfo(Js::CallFlags::CallFlags_Value, 2),
                                        undefinedVar,
                                        argument);
                }
                END_SAFE_REENTRANT_CALL
            }
            catch (const JavascriptException& err)
            {
                exception = err.GetAndClear();
            }
        }

        if (exception != nullptr)
        {
            return TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        Assert(handlerResult != nullptr);

        return TryCallResolveOrRejectHandler(promiseCapability->GetResolve(), handlerResult, scriptContext);
    }